

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

int __thiscall
booster::aio::stream_socket::connect(stream_socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  native_type __fd_00;
  uint uVar1;
  int iVar2;
  sockaddr *psVar3;
  pair<const_sockaddr_*,_int> pVar4;
  error_code eVar5;
  int res;
  native_address_type address;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  pVar4 = endpoint::raw((endpoint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  do {
    __fd_00 = basic_io_device::native((basic_io_device *)this);
    uVar1 = ::connect(__fd_00,(sockaddr *)pVar4.first,pVar4.second);
    psVar3 = (sockaddr *)(ulong)uVar1;
    if (-1 < (int)uVar1) break;
    psVar3 = (sockaddr *)__errno_location();
    iVar2._0_2_ = psVar3->sa_family;
    iVar2._2_1_ = psVar3->sa_data[0];
    iVar2._3_1_ = psVar3->sa_data[1];
  } while (iVar2 == 4);
  if ((int)uVar1 < 0) {
    eVar5 = socket_details::geterror();
    iVar2 = eVar5._M_value;
    __addr->sa_family = (short)iVar2;
    __addr->sa_data[0] = (char)((uint)iVar2 >> 0x10);
    __addr->sa_data[1] = (char)((uint)iVar2 >> 0x18);
    __addr->sa_data[2] = (char)in_stack_ffffffffffffffb4;
    __addr->sa_data[3] = (char)((uint)in_stack_ffffffffffffffb4 >> 8);
    __addr->sa_data[4] = (char)((uint)in_stack_ffffffffffffffb4 >> 0x10);
    __addr->sa_data[5] = (char)((uint)in_stack_ffffffffffffffb4 >> 0x18);
    *(error_category **)(__addr->sa_data + 6) = eVar5._M_cat;
    psVar3 = __addr;
  }
  return (int)psVar3;
}

Assistant:

void stream_socket::connect(endpoint const &ep,system::error_code &e)
{
	endpoint::native_address_type address = ep.raw();
	#ifndef BOOSTER_WIN32
	for(;;) {
		int res = ::connect(native(),address.first,address.second);
		if(res < 0 && errno==EINTR)
			continue;
		if(res < 0) {
			e=geterror();
			return;
		}
		break;
	}
	#else
	if(::connect(native(),address.first,address.second) < 0)
		e=geterror();
	#endif
}